

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::moveFromDataSpace(Forth *this,string *dst,Cell src,size_t count)

{
  size_type sVar1;
  pointer pcVar2;
  Char CVar3;
  size_type sVar4;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (dst,count,'\0');
  sVar1 = dst->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (dst->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      CVar3 = dataSpaceAt(this,src + (int)sVar4);
      pcVar2[sVar4] = CVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return;
}

Assistant:

void moveFromDataSpace(std::string &dst, Cell src, size_t count){
			dst.resize(count);
			for(auto &c : dst) c=dataSpaceAt(src++);
		}